

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

unqlite_value * unqlite_array_fetch(unqlite_value *pArray,char *zKey,int nByte)

{
  jx9_vm *pjVar1;
  char *pcVar2;
  sxi32 sVar3;
  char *pcVar4;
  jx9_hashmap_node *pNode;
  jx9_value skey;
  jx9_hashmap_node *local_60;
  anon_union_8_3_18420de5_for_x local_58;
  undefined8 uStack_50;
  jx9_vm *local_48;
  jx9_vm *pjStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((pArray->iFlags & 0x40) == 0) {
    return (unqlite_value *)0x0;
  }
  if (nByte < 0) {
    pcVar4 = zKey;
    if (*zKey != '\0') {
      pcVar2 = zKey + 2;
      do {
        pcVar4 = pcVar2;
        if (pcVar4[-1] == '\0') {
          pcVar4 = pcVar4 + -1;
          goto LAB_0010ce52;
        }
        if (*pcVar4 == '\0') goto LAB_0010ce52;
        if (pcVar4[1] == '\0') {
          pcVar4 = pcVar4 + 1;
          goto LAB_0010ce52;
        }
        pcVar2 = pcVar4 + 4;
      } while (pcVar4[2] != '\0');
      pcVar4 = pcVar4 + 2;
    }
LAB_0010ce52:
    nByte = (int)pcVar4 - (int)zKey;
  }
  local_48 = pArray->pVm;
  local_58.rVal = 0.0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  uStack_50 = 0x20;
  pjStack_40 = local_48;
  jx9MemObjStringAppend((jx9_value *)&local_58,zKey,nByte);
  sVar3 = jx9HashmapLookup((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)&local_58,&local_60);
  jx9MemObjRelease((jx9_value *)&local_58);
  if (sVar3 == 0) {
    pjVar1 = pArray->pVm;
    if (local_60->nValIdx < (pjVar1->aMemObj).nUsed) {
      return (unqlite_value *)
             ((ulong)(local_60->nValIdx * (pjVar1->aMemObj).eSize) + (long)(pjVar1->aMemObj).pBase);
    }
  }
  return (unqlite_value *)0x0;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_array_fetch(jx9_value *pArray, const char *zKey, int nByte)
{
	jx9_hashmap_node *pNode;
	jx9_value *pValue;
	jx9_value skey;
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return 0;
	}
	if( nByte < 0 ){
		nByte = (int)SyStrlen(zKey);
	}
	/* Convert the key to a jx9_value  */
	jx9MemObjInit(pArray->pVm, &skey);
	jx9MemObjStringAppend(&skey, zKey, (sxu32)nByte);
	/* Perform the lookup */
	rc = jx9HashmapLookup((jx9_hashmap *)pArray->x.pOther, &skey, &pNode);
	jx9MemObjRelease(&skey);
	if( rc != JX9_OK ){
		/* No such entry */
		return 0;
	}
	/* Extract the target value */
	pValue = (jx9_value *)SySetAt(&pArray->pVm->aMemObj, pNode->nValIdx);
	return pValue;
}